

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlock.cpp
# Opt level: O0

ushort __thiscall
Memory::SmallHeapBlockT<SmallAllocationBlockAttributes>::BuildFreeBitVector
          (SmallHeapBlockT<SmallAllocationBlockAttributes> *this,SmallHeapBlockBitVector *free)

{
  code *pcVar1;
  anon_class_24_3_be079e9c fn;
  bool bVar2;
  BOOLEAN BVar3;
  ushort uVar4;
  uint bitIndex_00;
  BVIndex BVar5;
  undefined4 *puVar6;
  SmallHeapBlockBitVector *pSVar7;
  SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes> *this_00;
  SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes> *finalizableBlock;
  FreeObject *pFStack_28;
  uint bitIndex;
  FreeObject *freeObject;
  SmallHeapBlockBitVector *pSStack_18;
  ushort freeCount;
  SmallHeapBlockBitVector *free_local;
  SmallHeapBlockT<SmallAllocationBlockAttributes> *this_local;
  
  pSStack_18 = free;
  free_local = (SmallHeapBlockBitVector *)this;
  BVStatic<256UL>::ClearAll(free);
  freeObject._6_2_ = 0;
  pFStack_28 = this->freeObjectList;
  do {
    if (pFStack_28 == (FreeObject *)0x0) {
      pSVar7 = GetDebugFreeBitVector(this);
      BVar5 = BVStatic<256UL>::Count(pSVar7);
      if (BVar5 != freeObject._6_2_) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                           ,0x76c,"(this->GetDebugFreeBitVector()->Count() == freeCount)",
                           "this->GetDebugFreeBitVector()->Count() == freeCount");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
      bVar2 = HeapBlock::IsAnyFinalizableBlock(&this->super_HeapBlock);
      if (bVar2) {
        this_00 = HeapBlock::AsFinalizableBlock<SmallAllocationBlockAttributes>
                            (&this->super_HeapBlock);
        fn.free = &stack0xffffffffffffffe8;
        fn.this = this;
        fn.freeCount = (ushort *)((long)&freeObject + 6);
        SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>::
        ForEachPendingDisposeObject<Memory::SmallHeapBlockT<SmallAllocationBlockAttributes>::BuildFreeBitVector(BVStatic<256ul>*)::_lambda(unsigned_int)_1_>
                  (this_00,fn);
        uVar4 = SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>::
                AddDisposedObjectFreeBitVector(this_00,pSStack_18);
        freeObject._6_2_ = freeObject._6_2_ + uVar4;
      }
      if (this->lastFreeCount < freeObject._6_2_) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                           ,0x77f,"(freeCount <= this->lastFreeCount)",
                           "freeCount <= this->lastFreeCount");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
      return freeObject._6_2_;
    }
    uVar4 = GetAddressBitIndex(pFStack_28);
    bitIndex_00 = (uint)uVar4;
    bVar2 = IsValidBitIndex(this,bitIndex_00);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                         ,0x766,"(IsValidBitIndex(bitIndex))","IsValidBitIndex(bitIndex)");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    pSVar7 = GetDebugFreeBitVector(this);
    BVar3 = BVStatic<256UL>::Test(pSVar7,bitIndex_00);
    if (BVar3 == '\0') {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                         ,0x767,"(this->GetDebugFreeBitVector()->Test(bitIndex))",
                         "this->GetDebugFreeBitVector()->Test(bitIndex)");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    BVStatic<256UL>::Set(pSStack_18,bitIndex_00);
    freeObject._6_2_ = freeObject._6_2_ + 1;
    pFStack_28 = FreeObject::GetNext(pFStack_28);
  } while( true );
}

Assistant:

ushort
SmallHeapBlockT<TBlockAttributes>::BuildFreeBitVector(SmallHeapBlockBitVector * free)
{
    free->ClearAll();
    ushort freeCount = 0;
    FreeObject * freeObject = this->freeObjectList;
    while (freeObject != nullptr)
    {
        uint bitIndex = GetAddressBitIndex(freeObject);
        Assert(IsValidBitIndex(bitIndex));
        Assert(this->GetDebugFreeBitVector()->Test(bitIndex));
        free->Set(bitIndex);
        freeCount++;
        freeObject = freeObject->GetNext();
    }
    Assert(this->GetDebugFreeBitVector()->Count() == freeCount);

    if (this->IsAnyFinalizableBlock())
    {
        auto finalizableBlock = this->AsFinalizableBlock<TBlockAttributes>();

        // Include pending dispose objects
        finalizableBlock->ForEachPendingDisposeObject([&] (uint index) {
            uint bitIndex = ((uint)index) * this->GetObjectBitDelta();
            Assert(IsValidBitIndex(bitIndex));
            Assert(!this->GetDebugFreeBitVector()->Test(bitIndex));
            free->Set(bitIndex);
            freeCount++;
        });

        // Include disposed objects
        freeCount += finalizableBlock->AddDisposedObjectFreeBitVector(free);
    }

    Assert(freeCount <= this->lastFreeCount);
    return freeCount;
}